

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

uint __thiscall ON_Mesh::CullDegenerateFaces(ON_Mesh *this)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = (this->m_F).m_count;
  DeleteComponents(this,(ON_COMPONENT_INDEX *)0x0,0,true,true,false,true);
  piVar1 = &(this->m_F).m_count;
  uVar3 = uVar2 - *piVar1;
  if (uVar2 < (uint)*piVar1) {
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

unsigned int ON_Mesh::CullDegenerateFaces()
{
  const unsigned int face_count0 = m_F.UnsignedCount();
  
  DeleteComponents(
    nullptr,
    0,
    true,  // bIgnoreInvalidComponents
    true,  // bRemoveDegenerateFaces
    false, // bRemoveUnusedVertices
    true   // bRemoveEmptyNgons
    );

  const unsigned int face_count1 = m_F.UnsignedCount();

  return (face_count0 > face_count1) ? face_count0 - face_count1 : 0;
}